

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::visitMemory(PrintSExpression *this,Memory *curr)

{
  ostream *poVar1;
  size_t sVar2;
  char cVar3;
  long **__s;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar1 = this->o;
  cVar3 = (char)this->indent;
  local_50 = local_40;
  if ((curr->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    printMemoryHeader(this,curr);
    poVar1 = this->o;
    __s = &local_50;
    local_50 = (long *)CONCAT71(local_50._1_7_,10);
    sVar2 = 1;
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_50._0_1_ = 0x28;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    emitImportHeader(this,&curr->super_Importable);
    printMemoryHeader(this,curr);
    local_50 = (long *)CONCAT71(local_50._1_7_,0x29);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    __s = (long **)this->maybeNewLine;
    if (__s == (long **)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
      return;
    }
    sVar2 = strlen((char *)__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)__s,sVar2);
  return;
}

Assistant:

void PrintSExpression::visitMemory(Memory* curr) {
  if (curr->imported()) {
    doIndent(o, indent);
    o << '(';
    emitImportHeader(curr);
    printMemoryHeader(curr);
    o << ')' << maybeNewLine;
  } else {
    doIndent(o, indent);
    printMemoryHeader(curr);
    o << '\n';
  }
}